

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O3

bool __thiscall
diligent_spirv_cross::CFG::node_terminates_control_flow_in_sub_graph
          (CFG *this,BlockID from,BlockID to)

{
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint32_t uVar5;
  bool bVar6;
  bool bVar7;
  Merge MVar8;
  SPIRBlock *pSVar9;
  const_iterator cVar10;
  ulong uVar11;
  SPIRBlock *pSVar12;
  SPIRBlock *to_00;
  bool bVar13;
  long lVar14;
  bool bVar15;
  DominatorBuilder builder;
  DominatorBuilder local_60;
  long local_50;
  SPIRBlock *local_48;
  ulong local_40;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  pSVar9 = Variant::get<diligent_spirv_cross::SPIRBlock>
                     ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                      from.id);
  bVar13 = true;
  if (to.id != from.id) {
    local_40 = (ulong)(pSVar9->merge_block).id;
    if (pSVar9->merge != MergeLoop) {
      local_40 = 0;
    }
    local_38 = &(this->preceding_edges)._M_h;
    local_50 = local_40 * 0x18;
    do {
      local_60.cfg = (CFG *)CONCAT44(local_60.cfg._4_4_,to.id);
      cVar10 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(local_38,(key_type *)&local_60);
      bVar13 = cVar10.
               super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
               ._M_cur != (__node_type *)0x0;
      if (cVar10.
          super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        return false;
      }
      local_60.dominator = 0;
      lVar3 = *(long *)((long)cVar10.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                              ._M_cur + 0x18);
      if (lVar3 == 0) {
        return false;
      }
      lVar4 = *(long *)((long)cVar10.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                              ._M_cur + 0x10);
      lVar14 = 0;
      local_60.cfg = this;
      do {
        DominatorBuilder::add_block(&local_60,*(uint32_t *)(lVar4 + lVar14));
        uVar5 = local_60.dominator;
        lVar14 = lVar14 + 4;
      } while (lVar3 << 2 != lVar14);
      if ((ulong)local_60.dominator == 0) {
        return false;
      }
      pSVar9 = Variant::get<diligent_spirv_cross::SPIRBlock>
                         ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                          ptr + local_60.dominator);
      MVar8 = pSVar9->merge;
      if (MVar8 == MergeNone) {
LAB_00349f04:
        bVar7 = true;
        if (local_40 == 0) {
          bVar6 = true;
        }
        else {
          bVar6 = true;
          if (*(int *)&(pSVar9->super_IVariant).field_0xc == 2) {
            pSVar12 = Variant::get<diligent_spirv_cross::SPIRBlock>
                                ((this->compiler->ir).ids.
                                 super_VectorView<diligent_spirv_cross::Variant>.ptr +
                                 (pSVar9->true_block).id);
            local_48 = Variant::get<diligent_spirv_cross::SPIRBlock>
                                 ((this->compiler->ir).ids.
                                  super_VectorView<diligent_spirv_cross::Variant>.ptr +
                                  (pSVar9->false_block).id);
            to_00 = Variant::get<diligent_spirv_cross::SPIRBlock>
                              ((Variant *)
                               ((long)&((this->compiler->ir).ids.
                                        super_VectorView<diligent_spirv_cross::Variant>.ptr)->group
                               + local_50));
            bVar6 = Compiler::execution_is_branchless(this->compiler,pSVar12,to_00);
            bVar7 = Compiler::execution_is_branchless(this->compiler,local_48,to_00);
            bVar7 = !bVar7;
            bVar6 = !bVar6;
          }
        }
      }
      else {
        if (MVar8 == MergeSelection) {
          uVar11 = (ulong)(pSVar9->next_block).id;
          if (uVar11 != 0) {
            pSVar12 = Variant::get<diligent_spirv_cross::SPIRBlock>
                                ((this->compiler->ir).ids.
                                 super_VectorView<diligent_spirv_cross::Variant>.ptr + uVar11);
            if (*(int *)&(pSVar12->super_IVariant).field_0xc == 5) goto LAB_00349f04;
            MVar8 = pSVar9->merge;
            goto LAB_00349ec1;
          }
LAB_00349eec:
          bVar15 = false;
        }
        else {
LAB_00349ec1:
          if ((MVar8 != MergeLoop) || (uVar11 = (ulong)(pSVar9->merge_block).id, uVar11 == 0))
          goto LAB_00349eec;
          pSVar12 = Variant::get<diligent_spirv_cross::SPIRBlock>
                              ((this->compiler->ir).ids.
                               super_VectorView<diligent_spirv_cross::Variant>.ptr + uVar11);
          bVar15 = *(int *)&(pSVar12->super_IVariant).field_0xc == 5;
        }
        if ((pSVar9->super_IVariant).self.id == from.id) goto LAB_00349f04;
        bVar7 = true;
        bVar6 = true;
        if (bVar15) goto LAB_00349f04;
      }
      if (pSVar9->merge == MergeLoop) {
        uVar1 = (pSVar9->merge_block).id;
joined_r0x00349fbd:
        if (uVar1 != to.id) goto LAB_00349fbf;
      }
      else {
        if (pSVar9->merge == MergeSelection) {
          uVar1 = (pSVar9->next_block).id;
          goto joined_r0x00349fbd;
        }
LAB_00349fbf:
        iVar2 = *(int *)&(pSVar9->super_IVariant).field_0xc;
        if (iVar2 == 2) {
          if ((!(bool)(~bVar7 & (pSVar9->true_block).id == to.id)) &&
             (bVar6 || (pSVar9->false_block).id != to.id)) {
            return false;
          }
        }
        else if ((iVar2 != 1) || ((pSVar9->next_block).id != to.id)) {
          return false;
        }
      }
      to.id = uVar5;
    } while (uVar5 != from.id);
  }
  return bVar13;
}

Assistant:

bool CFG::node_terminates_control_flow_in_sub_graph(BlockID from, BlockID to) const
{
	// Walk backwards, starting from "to" block.
	// Only follow pred edges if they have a 1:1 relationship, or a merge relationship.
	// If we cannot find a path to "from", we must assume that to is inside control flow in some way.

	auto &from_block = compiler.get<SPIRBlock>(from);
	BlockID ignore_block_id = 0;
	if (from_block.merge == SPIRBlock::MergeLoop)
		ignore_block_id = from_block.merge_block;

	while (to != from)
	{
		auto pred_itr = preceding_edges.find(to);
		if (pred_itr == end(preceding_edges))
			return false;

		DominatorBuilder builder(*this);
		for (auto &edge : pred_itr->second)
			builder.add_block(edge);

		uint32_t dominator = builder.get_dominator();
		if (dominator == 0)
			return false;

		auto &dom = compiler.get<SPIRBlock>(dominator);

		bool true_path_ignore = false;
		bool false_path_ignore = false;

		bool merges_to_nothing = dom.merge == SPIRBlock::MergeNone ||
		                         (dom.merge == SPIRBlock::MergeSelection && dom.next_block &&
		                          compiler.get<SPIRBlock>(dom.next_block).terminator == SPIRBlock::Unreachable) ||
		                         (dom.merge == SPIRBlock::MergeLoop && dom.merge_block &&
		                          compiler.get<SPIRBlock>(dom.merge_block).terminator == SPIRBlock::Unreachable);

		if (dom.self == from || merges_to_nothing)
		{
			// We can only ignore inner branchy paths if there is no merge,
			// i.e. no code is generated afterwards. E.g. this allows us to elide continue:
			// for (;;) { if (cond) { continue; } else { break; } }.
			// Codegen here in SPIR-V will be something like either no merge if one path directly breaks, or
			// we merge to Unreachable.
			if (ignore_block_id && dom.terminator == SPIRBlock::Select)
			{
				auto &true_block = compiler.get<SPIRBlock>(dom.true_block);
				auto &false_block = compiler.get<SPIRBlock>(dom.false_block);
				auto &ignore_block = compiler.get<SPIRBlock>(ignore_block_id);
				true_path_ignore = compiler.execution_is_branchless(true_block, ignore_block);
				false_path_ignore = compiler.execution_is_branchless(false_block, ignore_block);
			}
		}

		// Cases where we allow traversal. This serves as a proxy for post-dominance in a loop body.
		// TODO: Might want to do full post-dominance analysis, but it's a lot of churn for something like this ...
		// - We're the merge block of a selection construct. Jump to header.
		// - We're the merge block of a loop. Jump to header.
		// - Direct branch. Trivial.
		// - Allow cases inside a branch if the header cannot merge execution before loop exit.
		if ((dom.merge == SPIRBlock::MergeSelection && dom.next_block == to) ||
		    (dom.merge == SPIRBlock::MergeLoop && dom.merge_block == to) ||
		    (dom.terminator == SPIRBlock::Direct && dom.next_block == to) ||
		    (dom.terminator == SPIRBlock::Select && dom.true_block == to && false_path_ignore) ||
		    (dom.terminator == SPIRBlock::Select && dom.false_block == to && true_path_ignore))
		{
			// Allow walking selection constructs if the other branch reaches out of a loop construct.
			// It cannot be in-scope anymore.
			to = dominator;
		}
		else
			return false;
	}

	return true;
}